

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void dummy_Op_SetNativeFloatElementI_UInt32_NoConvert(void)

{
  return;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeFloatElementI_Int32_NoConvert(
        Var instance,
        int32 aElementIndex,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags,
        double dValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeFloatElementI_Int32_NoConvert);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeFloatElementI_NoConvert, Op_SetNativeFloatElementI_Int32);
        BOOL converted = OP_SetNativeFloatElementI_Int32(instance, aElementIndex, scriptContext, flags, dValue);
        if (converted)
        {
            AssertMsg(false, "Unexpected native array conversion");
            Js::Throw::FatalInternalError();
        }
        return FALSE;
        JIT_HELPER_END(Op_SetNativeFloatElementI_Int32_NoConvert);
    }